

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplerate.c
# Opt level: O1

int src_process(SRC_STATE *state,SRC_DATA *data)

{
  double dVar1;
  float *pfVar2;
  float *pfVar3;
  int iVar4;
  SRC_ERROR SVar5;
  
  if (state == (SRC_STATE *)0x0) {
    return 2;
  }
  iVar4 = 0x12;
  if (state->mode == SRC_MODE_PROCESS) {
    if (data == (SRC_DATA *)0x0) {
      return 3;
    }
    pfVar2 = data->data_in;
    if (((pfVar2 != (float *)0x0) || (iVar4 = 4, data->input_frames < 1)) &&
       ((pfVar3 = data->data_out, pfVar3 != (float *)0x0 || (iVar4 = 4, data->output_frames < 1))))
    {
      dVar1 = data->src_ratio;
      iVar4 = 6;
      if ((0.00390625 <= dVar1) && (dVar1 <= 256.0)) {
        if (data->input_frames < 0) {
          data->input_frames = 0;
        }
        if (data->output_frames < 0) {
          data->output_frames = 0;
        }
        if (pfVar2 < pfVar3) {
          iVar4 = 0x10;
          if (pfVar2 + (long)state->channels * data->input_frames <= pfVar3) {
LAB_001026b3:
            data->input_frames_used = 0;
            data->output_frames_gen = 0;
            if (state->last_ratio <= 0.00390625 && state->last_ratio != 0.00390625) {
              state->last_ratio = dVar1;
            }
            SVar5 = (*(&state->vt->vari_process)[ABS(state->last_ratio - dVar1) < 1e-15])
                              (state,data);
            return SVar5;
          }
        }
        else {
          iVar4 = 0x10;
          if (pfVar3 + (long)state->channels * data->output_frames <= pfVar2) goto LAB_001026b3;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int
src_process (SRC_STATE *state, SRC_DATA *data)
{
	int error ;

	if (state == NULL)
		return SRC_ERR_BAD_STATE ;

	if (state->mode != SRC_MODE_PROCESS)
		return SRC_ERR_BAD_MODE ;

	/* Check for valid SRC_DATA first. */
	if (data == NULL)
		return SRC_ERR_BAD_DATA ;

	/* And that data_in and data_out are valid. */
	if ((data->data_in == NULL && data->input_frames > 0)
			|| (data->data_out == NULL && data->output_frames > 0))
		return SRC_ERR_BAD_DATA_PTR ;

	/* Check src_ratio is in range. */
	if (is_bad_src_ratio (data->src_ratio))
		return SRC_ERR_BAD_SRC_RATIO ;

	if (data->input_frames < 0)
		data->input_frames = 0 ;
	if (data->output_frames < 0)
		data->output_frames = 0 ;

	if (data->data_in < data->data_out)
	{	if (data->data_in + data->input_frames * state->channels > data->data_out)
		{	/*-printf ("\n\ndata_in: %p    data_out: %p\n",
				(void*) (data->data_in + data->input_frames * psrc->channels), (void*) data->data_out) ;-*/
			return SRC_ERR_DATA_OVERLAP ;
			} ;
		}
	else if (data->data_out + data->output_frames * state->channels > data->data_in)
	{	/*-printf ("\n\ndata_in : %p   ouput frames: %ld    data_out: %p\n", (void*) data->data_in, data->output_frames, (void*) data->data_out) ;

		printf ("data_out: %p (%p)    data_in: %p\n", (void*) data->data_out,
			(void*) (data->data_out + data->input_frames * psrc->channels), (void*) data->data_in) ;-*/
		return SRC_ERR_DATA_OVERLAP ;
		} ;

	/* Set the input and output counts to zero. */
	data->input_frames_used = 0 ;
	data->output_frames_gen = 0 ;

	/* Special case for when last_ratio has not been set. */
	if (state->last_ratio < (1.0 / SRC_MAX_RATIO))
		state->last_ratio = data->src_ratio ;

	/* Now process. */
	if (fabs (state->last_ratio - data->src_ratio) < 1e-15)
		error = state->vt->const_process (state, data) ;
	else
		error = state->vt->vari_process (state, data) ;

	return error ;
}